

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O1

void __thiscall
duckdb::StarExpression::StarExpression
          (StarExpression *this,case_insensitive_set_t *exclude_list_p,
          qualified_column_set_t *qualified_set)

{
  qualified_column_set_t *pqVar1;
  __hashtable *__h;
  _Hash_node_base *p_Var2;
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_d8;
  string local_d0;
  QualifiedColumnName local_b0;
  
  (this->super_ParsedExpression).super_BaseExpression.type = STAR;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = STAR;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__StarExpression_0247cf78;
  (this->relation_name)._M_dataplus._M_p = (pointer)&(this->relation_name).field_2;
  (this->relation_name)._M_string_length = 0;
  (this->relation_name).field_2._M_local_buf[0] = '\0';
  pqVar1 = &this->exclude_list;
  ::std::
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&pqVar1->_M_h,qualified_set);
  (this->replace_list)._M_h._M_buckets = &(this->replace_list)._M_h._M_single_bucket;
  (this->replace_list)._M_h._M_bucket_count = 1;
  (this->replace_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->replace_list)._M_h._M_element_count = 0;
  (this->replace_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->replace_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->replace_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rename_list)._M_h._M_buckets = &(this->rename_list)._M_h._M_single_bucket;
  (this->rename_list)._M_h._M_bucket_count = 1;
  (this->rename_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rename_list)._M_h._M_element_count = 0;
  (this->rename_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rename_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rename_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->rename_list)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)
   ((long)&(this->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 1) = 0;
  p_Var2 = (exclude_list_p->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,p_Var2[1]._M_nxt,
                 (long)&(p_Var2[1]._M_nxt)->_M_nxt + (long)&(p_Var2[2]._M_nxt)->_M_nxt);
      QualifiedColumnName::QualifiedColumnName(&local_b0,&local_d0);
      local_d8 = &pqVar1->_M_h;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::QualifiedColumnName,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::QualifiedColumnName,true>>>>
                ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pqVar1,&local_b0,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.column._M_dataplus._M_p != &local_b0.column.field_2) {
        operator_delete(local_b0.column._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.table._M_dataplus._M_p != &local_b0.table.field_2) {
        operator_delete(local_b0.table._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.schema._M_dataplus._M_p != &local_b0.schema.field_2) {
        operator_delete(local_b0.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.catalog._M_dataplus._M_p != &local_b0.catalog.field_2) {
        operator_delete(local_b0.catalog._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

StarExpression::StarExpression(const case_insensitive_set_t &exclude_list_p, qualified_column_set_t qualified_set)
    : ParsedExpression(ExpressionType::STAR, ExpressionClass::STAR), exclude_list(std::move(qualified_set)) {
	for (auto &entry : exclude_list_p) {
		exclude_list.insert(QualifiedColumnName(entry));
	}
}